

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall QTreeView::mouseDoubleClickEvent(QTreeView *this,QMouseEvent *event)

{
  QTreeViewPrivate *this_00;
  QWidgetData *pQVar1;
  char cVar2;
  bool bVar3;
  State SVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  QStyle *pQVar9;
  QWidget *this_01;
  uint uVar10;
  quintptr qVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double extraout_XMM1_Qa;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  QPersistentModelIndex persistent;
  QPersistentModelIndex firstColumnIndex;
  ulong local_80;
  QModelIndex local_60;
  QPersistentModelIndex local_48;
  QPersistentModelIndex local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  SVar4 = QAbstractItemView::state((QAbstractItemView *)this);
  if (SVar4 != NoState) goto LAB_005af55e;
  pQVar1 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
           data;
  qVar11 = CONCAT44((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i,
                    (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i);
  local_60.r = 0;
  local_60.c = 0;
  local_60.i = qVar11;
  auVar20 = QEventPoint::position();
  auVar19._0_8_ =
       (double)((ulong)auVar20._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar20._8_8_;
  auVar19._8_8_ =
       (double)((ulong)auVar20._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar20._0_8_;
  auVar19 = minpd(_DAT_0066f5d0,auVar19);
  auVar20._8_8_ = -(ulong)(-2147483648.0 < auVar19._8_8_);
  auVar20._0_8_ = -(ulong)(-2147483648.0 < auVar19._0_8_);
  uVar10 = movmskpd((int)qVar11,auVar20);
  uVar12 = (ulong)(uint)(int)auVar19._8_8_;
  uVar7 = (ulong)(uint)(int)auVar19._0_8_ << 0x20;
  if ((uVar10 & 1) == 0) {
    uVar7 = 0x8000000000000000;
  }
  if ((uVar10 & 2) == 0) {
    uVar12 = 0x80000000;
  }
  local_40.d = (QPersistentModelIndexData *)(uVar12 | uVar7);
  cVar2 = QRect::contains((QPoint *)&local_60,SUB81(&local_40,0));
  if (cVar2 == '\0') goto LAB_005af55e;
  auVar19 = QEventPoint::position();
  auVar14._0_8_ =
       (double)((ulong)auVar19._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar19._8_8_;
  auVar14._8_8_ =
       (double)((ulong)auVar19._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar19._0_8_;
  auVar19 = minpd(_DAT_0066f5d0,auVar14);
  auVar15._8_8_ = -(ulong)(-2147483648.0 < auVar19._8_8_);
  auVar15._0_8_ = -(ulong)(-2147483648.0 < auVar19._0_8_);
  uVar10 = movmskpd(uVar10,auVar15);
  local_60._0_8_ = ZEXT48((uint)(int)auVar19._8_8_);
  uVar7 = (ulong)(uint)(int)auVar19._0_8_ << 0x20;
  if ((uVar10 & 1) == 0) {
    uVar7 = 0x8000000000000000;
  }
  if ((uVar10 & 2) == 0) {
    local_60._0_8_ = 0x80000000;
  }
  local_60._0_8_ = local_60._0_8_ | uVar7;
  iVar5 = QTreeViewPrivate::itemDecorationAt(this_00,(QPoint *)&local_60);
  if (iVar5 != -1) goto LAB_005af55e;
  QEventPoint::position();
  dVar13 = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | (ulong)DAT_0066f5c0) +
           extraout_XMM1_Qa;
  dVar18 = 2147483647.0;
  if (dVar13 <= 2147483647.0) {
    dVar18 = dVar13;
  }
  if (dVar18 <= -2147483648.0) {
    dVar18 = -2147483648.0;
  }
  uVar6 = QTreeViewPrivate::itemAtCoordinate(this_00,(int)dVar18);
  local_80 = (ulong)uVar6;
  if (uVar6 == 0xffffffff) goto LAB_005af55e;
  local_40.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  lVar8 = (long)(int)uVar6;
  QPersistentModelIndex::QPersistentModelIndex(&local_40,&(this_00->viewItems).d.ptr[lVar8].index);
  local_48.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  auVar19 = QEventPoint::position();
  auVar16._0_8_ =
       (double)((ulong)auVar19._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar19._8_8_;
  auVar16._8_8_ =
       (double)((ulong)auVar19._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar19._0_8_;
  auVar19 = minpd(_DAT_0066f5d0,auVar16);
  auVar17._8_8_ = -(ulong)(-2147483648.0 < auVar19._8_8_);
  auVar17._0_8_ = -(ulong)(-2147483648.0 < auVar19._0_8_);
  movmskpd(uVar10,auVar17);
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x1f0))(&local_60,this);
  QPersistentModelIndex::QPersistentModelIndex(&local_48,&local_60);
  cVar2 = comparesEqual(&(this_00->super_QAbstractItemViewPrivate).pressedIndex,&local_48);
  if (cVar2 == '\0') {
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x98))(this,event);
  }
  else {
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&local_48);
    QAbstractItemView::doubleClicked((QAbstractItemView *)this,&local_60);
    cVar2 = QPersistentModelIndex::isValid();
    if (cVar2 != '\0') {
      QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&local_48);
      cVar2 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget + 0x2e0))(this,&local_60,2,event);
      if ((cVar2 == '\0') &&
         (SVar4 = QAbstractItemView::state((QAbstractItemView *)this), SVar4 == NoState)) {
        pQVar9 = QWidget::style((QWidget *)this);
        iVar5 = (**(code **)(*(long *)pQVar9 + 0xf0))(pQVar9,0x3d,0,this,0);
        if (iVar5 == 0) {
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&local_48);
          QAbstractItemView::activated((QAbstractItemView *)this,&local_60);
        }
        (this_00->super_QAbstractItemViewPrivate).releaseFromDoubleClick = true;
        QAbstractItemViewPrivate::executePostedLayout(&this_00->super_QAbstractItemViewPrivate);
        if ((this_00->itemsExpandable == true) && (this_00->expandsOnDoubleClick == true)) {
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&local_48);
          bVar3 = QTreeViewPrivate::hasVisibleChildren(this_00,&local_60);
          if (bVar3) {
            if (((this_00->viewItems).d.size <= lVar8) ||
               (cVar2 = comparesEqual(&local_40,&(this_00->viewItems).d.ptr[lVar8].index),
               cVar2 == '\0')) {
              if ((this_00->viewItems).d.size == 0) {
                local_80 = 0;
              }
              else {
                lVar8 = 0;
                local_80 = 0;
                do {
                  cVar2 = comparesEqual(&local_40,
                                        (QModelIndex *)
                                        ((long)&(((this_00->viewItems).d.ptr)->index).r + lVar8));
                  if (cVar2 != '\0') break;
                  local_80 = local_80 + 1;
                  lVar8 = lVar8 + 0x28;
                } while (local_80 < (ulong)(this_00->viewItems).d.size);
              }
              if ((this_00->viewItems).d.size == local_80) goto LAB_005af54a;
            }
            iVar5 = (int)local_80;
            if (((this_00->viewItems).d.ptr[iVar5].field_0x1c & 1) == 0) {
              QTreeViewPrivate::expand(this_00,iVar5,true);
            }
            else {
              QTreeViewPrivate::collapse(this_00,iVar5,true);
            }
            (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget + 0x268))(this);
            this_01 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
            QWidget::update(this_01);
          }
        }
      }
    }
  }
LAB_005af54a:
  QPersistentModelIndex::~QPersistentModelIndex(&local_48);
  QPersistentModelIndex::~QPersistentModelIndex(&local_40);
LAB_005af55e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeView::mouseDoubleClickEvent(QMouseEvent *event)
{
    Q_D(QTreeView);
    if (state() != NoState || !d->viewport->rect().contains(event->position().toPoint()))
        return;

    int i = d->itemDecorationAt(event->position().toPoint());
    if (i == -1) {
        i = d->itemAtCoordinate(event->position().toPoint().y());
        if (i == -1)
            return; // user clicked outside the items

        const QPersistentModelIndex firstColumnIndex = d->viewItems.at(i).index;
        const QPersistentModelIndex persistent = indexAt(event->position().toPoint());

        if (d->pressedIndex != persistent) {
            mousePressEvent(event);
            return;
        }

        // signal handlers may change the model
        emit doubleClicked(persistent);

        if (!persistent.isValid())
            return;

        if (edit(persistent, DoubleClicked, event) || state() != NoState)
            return; // the double click triggered editing

        if (!style()->styleHint(QStyle::SH_ItemView_ActivateItemOnSingleClick, nullptr, this))
            emit activated(persistent);

        d->releaseFromDoubleClick = true;
        d->executePostedLayout(); // we need to make sure viewItems is updated
        if (d->itemsExpandable
            && d->expandsOnDoubleClick
            && d->hasVisibleChildren(persistent)) {
            if (!((i < d->viewItems.size()) && (d->viewItems.at(i).index == firstColumnIndex))) {
                // find the new index of the item
                for (i = 0; i < d->viewItems.size(); ++i) {
                    if (d->viewItems.at(i).index == firstColumnIndex)
                        break;
                }
                if (i == d->viewItems.size())
                    return;
            }
            if (d->viewItems.at(i).expanded)
                d->collapse(i, true);
            else
                d->expand(i, true);
            updateGeometries();
            viewport()->update();
        }
    }
}